

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_isPublicId(ENCODING *enc,char *ptr,char *end,char **badPtr)

{
  uint uVar1;
  char **badPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  end_local = ptr + 1;
  do {
    if ((long)(end + (-1 - (long)end_local)) < 1) {
      return 1;
    }
    uVar1 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
    if ((1 < uVar1 - 9) && (6 < uVar1 - 0xd)) {
      if (uVar1 == 0x15) {
        if (*end_local == '\t') {
          *badPtr = end_local;
          return 0;
        }
      }
      else if (uVar1 == 0x16) {
LAB_008b9f74:
        if ((*end_local & 0x80U) != 0) {
LAB_008b9f87:
          if ((*end_local != '$') && (*end_local != '@')) {
            *badPtr = end_local;
            return 0;
          }
        }
      }
      else if (1 < uVar1 - 0x18) {
        if (uVar1 == 0x1a) goto LAB_008b9f74;
        if ((uVar1 == 0x1b) || (uVar1 - 0x1e < 6)) goto LAB_008b9fbc;
        goto LAB_008b9f87;
      }
    }
LAB_008b9fbc:
    end_local = end_local + 1;
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(isPublicId)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **badPtr)
{
  ptr += MINBPC(enc);
  end -= MINBPC(enc);
  for (; HAS_CHAR(enc, ptr, end); ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_DIGIT:
    case BT_HEX:
    case BT_MINUS:
    case BT_APOS:
    case BT_LPAR:
    case BT_RPAR:
    case BT_PLUS:
    case BT_COMMA:
    case BT_SOL:
    case BT_EQUALS:
    case BT_QUEST:
    case BT_CR:
    case BT_LF:
    case BT_SEMI:
    case BT_EXCL:
    case BT_AST:
    case BT_PERCNT:
    case BT_NUM:
#ifdef XML_NS
    case BT_COLON:
#endif
      break;
    case BT_S:
      if (CHAR_MATCHES(enc, ptr, ASCII_TAB)) {
        *badPtr = ptr;
        return 0;
      }
      break;
    case BT_NAME:
    case BT_NMSTRT:
      if (!(BYTE_TO_ASCII(enc, ptr) & ~0x7f))
        break;
    default:
      switch (BYTE_TO_ASCII(enc, ptr)) {
      case 0x24: /* $ */
      case 0x40: /* @ */
        break;
      default:
        *badPtr = ptr;
        return 0;
      }
      break;
    }
  }
  return 1;
}